

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

void __thiscall sc_core::vcd_trace_file::~vcd_trace_file(vcd_trace_file *this)

{
  ulong uVar1;
  vcd_trace *pvVar2;
  bool bVar3;
  pointer ppvVar4;
  pointer ppvVar5;
  long lVar6;
  unit_type now_units_low;
  unit_type now_units_high;
  ulong local_20;
  ulong local_18;
  
  (this->super_sc_trace_file_base).super_sc_trace_file._vptr_sc_trace_file =
       (_func_int **)&PTR_trace_0026de60;
  (this->super_sc_trace_file_base).super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_0026dfa0;
  bVar3 = sc_trace_file_base::is_initialized(&this->super_sc_trace_file_base);
  if (bVar3) {
    sc_trace_file_base::timestamp_in_trace_units
              (&this->super_sc_trace_file_base,&local_18,&local_20);
    uVar1 = this->previous_time_units_high;
    if (local_18 == uVar1 && this->previous_time_units_low < local_20 ||
        uVar1 <= local_18 && local_18 != uVar1) {
      print_time_stamp(this,local_18,local_20);
    }
  }
  ppvVar5 = (this->traces).
            super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar4 = (this->traces).
            super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppvVar4 - (long)ppvVar5) >> 3)) {
    lVar6 = 0;
    do {
      pvVar2 = ppvVar5[lVar6];
      if (pvVar2 != (vcd_trace *)0x0) {
        (*pvVar2->_vptr_vcd_trace[5])(pvVar2);
        ppvVar5 = (this->traces).
                  super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppvVar4 = (this->traces).
                  super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)((ulong)((long)ppvVar4 - (long)ppvVar5) >> 3));
  }
  if (ppvVar5 != (pointer)0x0) {
    operator_delete(ppvVar5);
  }
  sc_trace_file_base::~sc_trace_file_base(&this->super_sc_trace_file_base);
  return;
}

Assistant:

vcd_trace_file::~vcd_trace_file()
{
    unit_type now_units_high, now_units_low;
    if (is_initialized() && get_time_stamp(now_units_high,now_units_low)) {
        print_time_stamp(now_units_high, now_units_low);
    }

    for( int i = 0; i < (int)traces.size(); i++ ) {
        vcd_trace* t = traces[i];
        delete t;
    }
}